

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausAddToStorage(Clu_Man_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  pVVar4 = p->vClauses;
  if (pVVar4->nSize < 1) {
    uVar7 = 0;
  }
  else {
    piVar3 = p->vLits->pArray;
    lVar8 = 0;
    uVar7 = 0;
    iVar6 = 0;
    do {
      if (p->vCosts->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar4->pArray[lVar8];
      iVar2 = p->vCosts->pArray[lVar8];
      if (iVar2 != -1) {
        if (iVar2 < 1) {
          __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                        ,0x5aa,"void Fra_ClausAddToStorage(Clu_Man_t *)");
        }
        if (p->nLutSize < iVar1 - iVar6) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                        ,0x5ab,"void Fra_ClausAddToStorage(Clu_Man_t *)");
        }
        if (iVar6 < iVar1) {
          lVar5 = 0;
          do {
            Vec_IntPush(p->vLitsProven,piVar3[iVar6 + lVar5]);
            lVar5 = lVar5 + 1;
          } while (iVar1 - iVar6 != (int)lVar5);
        }
        Vec_IntPush(p->vClausesProven,p->vLitsProven->nSize);
        uVar7 = uVar7 + 1;
        if (lVar8 < p->nOneHots) {
          p->nOneHotsProven = p->nOneHotsProven + 1;
        }
      }
      lVar8 = lVar8 + 1;
      pVVar4 = p->vClauses;
      iVar6 = iVar1;
    } while (lVar8 < pVVar4->nSize);
  }
  if (p->fVerbose != 0) {
    printf("Added to storage %d proved clauses (including %d one-hot clauses)\n",(ulong)uVar7,
           (ulong)(uint)p->nOneHotsProven);
  }
  p->vClauses->nSize = 0;
  p->vLits->nSize = 0;
  p->vCosts->nSize = 0;
  p->nClauses = 0;
  p->fNothingNew = (uint)(uVar7 == 0);
  return;
}

Assistant:

void Fra_ClausAddToStorage( Clu_Man_t * p )
{
    int * pStart; 
    int Beg, End, Counter, i, k;
    Beg = 0;
    Counter = 0;
    pStart = Vec_IntArray( p->vLits );
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );
        for ( k = Beg; k < End; k++ )
            Vec_IntPush( p->vLitsProven, pStart[k] );
        Vec_IntPush( p->vClausesProven, Vec_IntSize(p->vLitsProven) );
        Beg = End;
        Counter++;

        if ( i < p->nOneHots )
            p->nOneHotsProven++;
    }
    if ( p->fVerbose )
    printf( "Added to storage %d proved clauses (including %d one-hot clauses)\n", Counter, p->nOneHotsProven );

    Vec_IntClear( p->vClauses );
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vCosts );
    p->nClauses = 0;

    p->fNothingNew = (int)(Counter == 0);
}